

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void int_linear_dom(vec<int> *a,vec<IntVar_*> *x,int c)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  IntVar **ppIVar5;
  IntVar *pIVar6;
  ulong uVar7;
  int k;
  vec<vec<int>_> t;
  int local_54;
  int local_50;
  int local_4c;
  vec<vec<int>_> local_48;
  
  if (x->sz != 0) {
    uVar7 = 0;
    do {
      IntVar::specialiseToEL(x->data[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 < x->sz);
  }
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (vec<int> *)0x0;
  ppIVar5 = x->data;
  pIVar6 = *ppIVar5;
  iVar4 = (pIVar6->min).v;
  local_54 = iVar4;
  if (iVar4 <= (pIVar6->max).v) {
    do {
      local_54 = iVar4;
      if (((pIVar6->min).v <= iVar4) &&
         ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[iVar4].v != '\0')))) {
        iVar3 = (ppIVar5[1]->min).v;
        ppIVar5 = x->data;
        pIVar6 = ppIVar5[1];
        local_50 = iVar3;
        if (iVar3 <= (pIVar6->max).v) {
          do {
            local_50 = iVar3;
            iVar4 = local_4c;
            if (((pIVar6->min).v <= iVar3) &&
               ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[iVar3].v != '\0')))) {
              piVar1 = a->data;
              iVar4 = iVar3 * piVar1[1] + (c - local_54 * *piVar1);
              local_4c = iVar4 / piVar1[2];
              if ((iVar4 % piVar1[2] == 0) &&
                 (((pIVar6 = ppIVar5[2], iVar4 = local_4c, (pIVar6->min).v <= local_4c &&
                   (local_4c <= (pIVar6->max).v)) &&
                  ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[local_4c].v != '\0')))))) {
                vec<vec<int>_>::push(&local_48);
                vec<int>::push(local_48.data + (local_48.sz - 1),&local_54);
                vec<int>::push(local_48.data + (local_48.sz - 1),&local_50);
                vec<int>::push(local_48.data + (local_48.sz - 1),&local_4c);
                iVar4 = local_4c;
              }
            }
            local_4c = iVar4;
            iVar3 = local_50 + 1;
            ppIVar5 = x->data;
            pIVar6 = ppIVar5[1];
            bVar2 = local_50 < (pIVar6->max).v;
            local_50 = iVar3;
          } while (bVar2);
        }
      }
      iVar4 = local_54 + 1;
      ppIVar5 = x->data;
      pIVar6 = *ppIVar5;
      bVar2 = local_54 < (pIVar6->max).v;
      local_54 = iVar4;
    } while (bVar2);
  }
  table_GAC(x,&local_48);
  vec<vec<int>_>::~vec(&local_48);
  return;
}

Assistant:

void int_linear_dom(vec<int>& a, vec<IntVar*>& x, int c) {
	assert(a.size() == 3 && x.size() == 3);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}

	vec<vec<int> > t;
	for (int i = x[0]->getMin(); i <= x[0]->getMax(); i++) {
		if (!x[0]->indomain(i)) {
			continue;
		}
		for (int j = x[1]->getMin(); j <= x[1]->getMax(); j++) {
			if (!x[1]->indomain(j)) {
				continue;
			}
			int k = c - a[0] * i + a[1] * j;
			if (k % a[2] != 0) {
				continue;
			}
			k /= a[2];
			if (!x[2]->indomain(k)) {
				continue;
			}
			t.push();
			t.last().push(i);
			t.last().push(j);
			t.last().push(k);
		}
	}

	table_GAC(x, t);
}